

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O1

bool dxil_spv::get_image_dimensions_query_size
               (Impl *impl,Builder *builder,Id image_id,uint32_t *num_coords)

{
  bool bVar1;
  bool bVar2;
  Id typeId;
  Dim DVar3;
  LoggingCallback p_Var4;
  void *pvVar5;
  char buffer [4096];
  char local_1028 [4104];
  
  typeId = Converter::Impl::get_type_id(impl,image_id);
  DVar3 = spv::Builder::getTypeDimensionality(builder,typeId);
  bVar1 = spv::Builder::isArrayedImageType(builder,typeId);
  if ((DVar3 < DimSubpassData) && ((0x2fU >> (DVar3 & 0x1f) & 1) != 0)) {
    *num_coords = *(uint32_t *)(&DAT_001c7558 + (ulong)DVar3 * 4);
    bVar2 = true;
    if (bVar1) {
      *num_coords = *num_coords + 1;
    }
  }
  else {
    p_Var4 = get_thread_log_callback();
    if (p_Var4 == (LoggingCallback)0x0) {
      get_image_dimensions_query_size();
    }
    else {
      builtin_strncpy(local_1028,"Unexpected sample dimensionality.\n",0x23);
      pvVar5 = get_thread_log_callback_userdata();
      (*p_Var4)(pvVar5,Error,local_1028);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool get_image_dimensions_query_size(Converter::Impl &impl, spv::Builder &builder, spv::Id image_id,
                                     uint32_t *num_coords)
{
	spv::Id image_type_id = impl.get_type_id(image_id);
	spv::Dim dim = builder.getTypeDimensionality(image_type_id);
	bool is_array = builder.isArrayedImageType(image_type_id);

	switch (dim)
	{
	case spv::Dim1D:
	case spv::DimBuffer:
		*num_coords = 1;
		break;

	case spv::Dim2D:
	case spv::DimCube:
		*num_coords = 2;
		break;

	case spv::Dim3D:
		*num_coords = 3;
		break;

	default:
		LOGE("Unexpected sample dimensionality.\n");
		return false;
	}

	if (is_array)
		(*num_coords)++;

	return true;
}